

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O0

void cgltf_write_line(cgltf_write_context *context,char *line)

{
  int iVar1;
  size_t sVar2;
  cgltf_size last;
  char *line_local;
  cgltf_write_context *context_local;
  
  if ((*line == ']') || (*line == '}')) {
    context->depth = context->depth + -1;
    context->needs_comma = 0;
  }
  cgltf_write_indent(context);
  iVar1 = snprintf(context->cursor,context->remaining,"%s",line);
  context->tmp = (long)iVar1;
  context->chars_written = context->tmp + context->chars_written;
  if (context->cursor != (char *)0x0) {
    context->cursor = context->cursor + context->tmp;
    context->remaining = context->remaining - context->tmp;
  }
  sVar2 = strlen(line);
  if ((*line == ']') || (*line == '}')) {
    context->needs_comma = 1;
  }
  if ((line[sVar2 - 1] == '[') || (line[sVar2 - 1] == '{')) {
    context->depth = context->depth + 1;
    context->needs_comma = 0;
  }
  return;
}

Assistant:

static void cgltf_write_line(cgltf_write_context* context, const char* line)
{
	if (line[0] == ']' || line[0] == '}')
	{
		--context->depth;
		context->needs_comma = 0;
	}
	cgltf_write_indent(context);
	CGLTF_SPRINTF("%s", line);
	cgltf_size last = (cgltf_size)(strlen(line) - 1);
	if (line[0] == ']' || line[0] == '}')
	{
		context->needs_comma = 1;
	}
	if (line[last] == '[' || line[last] == '{')
	{
		++context->depth;
		context->needs_comma = 0;
	}
}